

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_create_objects_tree.cpp
# Opt level: O0

int main(void)

{
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>
  local_9 [8];
  i injector;
  
  boost::ext::di::v1_3_0::make_injector<boost::ext::di::v1_3_0::config,_0,_0>();
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>
  ::create<app,_0>(local_9);
  return 0;
}

Assistant:

int main() {
  /**
   * renderer renderer_;
   * view view_{"", renderer_};
   * model model_;
   * controller controller_{model_, view_};
   * user user_;
   * app app_{controller_, user_};
   */

  auto injector = di::make_injector();
  injector.create<app>();
}